

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O2

int compressor_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  info->name = "compressor";
  info->description = "Dynamically compress the audio volume.";
  info->flags = MIXED_IN;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  set_info_field(info->fields + 1,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  set_info_field(info->fields + 2,0x2c,MIXED_DECIBEL_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The gain before compression, in dB.");
  set_info_field(info->fields + 3,0x2d,MIXED_DECIBEL_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The threshold to activate compression, in dB.");
  set_info_field(info->fields + 4,0x2e,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,"The compression knee."
                );
  set_info_field(info->fields + 5,0x2f,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The compression ratio.");
  set_info_field(info->fields + 6,0x30,MIXED_DURATION_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The attack time in seconds.");
  set_info_field(info->fields + 7,0x31,MIXED_DURATION_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The release time in seconds.");
  set_info_field(info->fields + 8,0x32,MIXED_DURATION_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The delay before compression, in seconds.");
  set_info_field(info->fields + 9,0x33,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The release zones of the compressor.");
  set_info_field(info->fields + 10,0x34,MIXED_DECIBEL_T,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "The gain after compressin, in dB.");
  set_info_field(info->fields + 0xb,0x29,9,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,"The dry/wet mix");
  set_info_field(info->fields + 0xc,0x35,9,1,MIXED_GET|MIXED_SEGMENT,
                 "Retrieve the actual gain that was set during the last mixing step.");
  clear_info_field(info->fields + 0xd);
  return 1;
}

Assistant:

int compressor_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  info->name = "compressor";
  info->description = "Dynamically compress the audio volume.";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 1;
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");

  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");

  set_info_field(field++, MIXED_COMPRESSOR_PREGAIN,
                 MIXED_DECIBEL_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The gain before compression, in dB.");

  set_info_field(field++, MIXED_COMPRESSOR_THRESHOLD,
                 MIXED_DECIBEL_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The threshold to activate compression, in dB.");

  set_info_field(field++, MIXED_COMPRESSOR_KNEE,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The compression knee.");

  set_info_field(field++, MIXED_COMPRESSOR_RATIO,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The compression ratio.");

  set_info_field(field++, MIXED_COMPRESSOR_ATTACK,
                 MIXED_DURATION_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The attack time in seconds.");

  set_info_field(field++, MIXED_COMPRESSOR_RELEASE,
                 MIXED_DURATION_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The release time in seconds.");

  set_info_field(field++, MIXED_COMPRESSOR_PREDELAY,
                 MIXED_DURATION_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The delay before compression, in seconds.");

  set_info_field(field++, MIXED_COMPRESSOR_RELEASEZONE,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The release zones of the compressor.");

  set_info_field(field++, MIXED_COMPRESSOR_POSTGAIN,
                 MIXED_DECIBEL_T, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The gain after compressin, in dB.");

  set_info_field(field++, MIXED_MIX,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "The dry/wet mix");

  set_info_field(field++, MIXED_COMPRESSOR_GAIN,
                 MIXED_FLOAT, 1, MIXED_SEGMENT | MIXED_GET,
                 "Retrieve the actual gain that was set during the last mixing step.");

  clear_info_field(field++);
  return 1;
}